

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::Data
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this,
          Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *other)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *in_RDI;
  long in_FS_OFFSET;
  R_conflict29 RVar3;
  Node<QString,_QMimeTypeXMLData> *newNode;
  Node<QString,_QMimeTypeXMLData> *n;
  size_t index;
  Span *span;
  size_t s;
  R_conflict29 r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  (((QString *)in_RDI->offsets)->d).ptr = *(char16_t **)(in_RSI + 8);
  (((QString *)in_RDI->offsets)->d).size = *(qsizetype *)(in_RSI + 0x10);
  *(undefined8 *)((QString *)in_RDI->offsets + 1) = *(undefined8 *)(in_RSI + 0x18);
  (((QMimeTypeXMLData *)((QString *)in_RDI->offsets + 1))->name).d.d = (Data *)0x0;
  RVar3 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar3.spans;
  (((QMimeTypeXMLData *)((QString *)in_RDI->offsets + 1))->name).d.d = (Data *)local_28;
  local_20 = RVar3.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar2 = Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::hasNode
                        ((Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)
                         (lVar1 + local_48 * 0x90),local_58);
      if (bVar2) {
        Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::at(this_00,(size_t)in_RDI);
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        Bucket::insert((Bucket *)0x90a60b);
        Node<QString,_QMimeTypeXMLData>::Node
                  ((Node<QString,_QMimeTypeXMLData> *)this_00,
                   (Node<QString,_QMimeTypeXMLData> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }